

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O2

void __thiscall JUnitTestOutput::~JUnitTestOutput(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *this_00;
  
  (this->super_TestOutput)._vptr_TestOutput = (_func_int **)&PTR__JUnitTestOutput_0015f5b0;
  resetTestGroupResult(this);
  this_00 = this->impl_;
  if (this_00 != (JUnitTestOutputImpl *)0x0) {
    JUnitTestOutputImpl::~JUnitTestOutputImpl(this_00);
  }
  operator_delete(this_00,0x70);
  TestOutput::~TestOutput(&this->super_TestOutput);
  return;
}

Assistant:

JUnitTestOutput::~JUnitTestOutput()
{
    resetTestGroupResult();
    delete impl_;
}